

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateStrings
          (ParseFunctionGenerator *this,Formatter *format,FieldDescriptor *field,bool check_utf8)

{
  bool bVar1;
  FileOptions_OptimizeMode FVar2;
  FieldOptions *this_00;
  FileDescriptor *pFVar3;
  ulong uVar4;
  OneofDescriptor *pOVar5;
  string *str;
  AlphaNum *in_R8;
  byte local_162;
  AlphaNum local_140;
  AlphaNum local_110;
  AlphaNum local_e0;
  string local_b0;
  undefined1 local_90 [8];
  string field_name;
  char *pcStack_68;
  Utf8CheckMode level;
  char *local_60 [3];
  undefined1 local_48 [8];
  string parser_name;
  CType ctype;
  bool check_utf8_local;
  FieldDescriptor *field_local;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  parser_name.field_2._8_4_ = 0;
  parser_name.field_2._M_local_buf[0xf] = check_utf8;
  if ((this->options_->opensource_runtime & 1U) == 0) {
    this_00 = FieldDescriptor::options(field);
    parser_name.field_2._8_4_ = FieldOptions::ctype(this_00);
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if ((!bVar1) && ((this->options_->opensource_runtime & 1U) == 0)) {
    pFVar3 = FieldDescriptor::file(field);
    FVar2 = GetOptimizeFor(pFVar3,this->options_);
    if (FVar2 != FileOptions_OptimizeMode_LITE_RUNTIME) {
      FieldDescriptor::default_value_string_abi_cxx11_(field);
      uVar4 = std::__cxx11::string::empty();
      if ((((uVar4 & 1) != 0) &&
          (pOVar5 = FieldDescriptor::real_containing_oneof(field), pOVar5 == (OneofDescriptor *)0x0)
          ) && (parser_name.field_2._8_4_ == 0)) {
        GenerateArenaString(this,format,field);
        goto LAB_00544302;
      }
    }
  }
  std::__cxx11::string::string((string *)local_48);
  if (parser_name.field_2._8_4_ == 0) {
    std::__cxx11::string::operator=((string *)local_48,"GreedyStringParser");
  }
  else if (parser_name.field_2._8_4_ == 1) {
    std::__cxx11::string::operator=((string *)local_48,"CordParser");
  }
  else if (parser_name.field_2._8_4_ == 2) {
    std::__cxx11::string::operator=((string *)local_48,"StringPieceParser");
  }
  bVar1 = anon_unknown_6::HasInternalAccessors(parser_name.field_2._8_4_);
  local_60[0] = "";
  if (bVar1) {
    local_60[0] = "_internal_";
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  local_162 = 0;
  if (bVar1) {
    bVar1 = FieldDescriptor::is_packable(field);
    local_162 = bVar1 ^ 0xff;
  }
  pcStack_68 = "mutable";
  if ((local_162 & 1) != 0) {
    pcStack_68 = "add";
  }
  in_R8 = (AlphaNum *)local_48;
  Formatter::operator()
            (format,
             "auto str = $msg$$1$$2$_$name$();\nptr = ::$proto_ns$::internal::Inline$3$(str, ptr, ctx);\n"
             ,local_60,&stack0xffffffffffffff98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8);
  std::__cxx11::string::~string((string *)local_48);
LAB_00544302:
  if ((parser_name.field_2._M_local_buf[0xf] & 1U) != 0) {
    field_name.field_2._12_4_ = GetUtf8CheckMode(field,this->options_);
    if (field_name.field_2._12_4_ == kStrict) {
      Formatter::operator()<>(format,"CHK_(");
    }
    else if (field_name.field_2._12_4_ == kVerify) {
      Formatter::operator()<>(format,"#ifndef NDEBUG\n");
    }
    else if (field_name.field_2._12_4_ == kNone) {
      return;
    }
    std::__cxx11::string::string((string *)local_90);
    std::__cxx11::string::operator=((string *)local_90,"nullptr");
    pFVar3 = FieldDescriptor::file(field);
    bVar1 = HasDescriptorMethods(pFVar3,this->options_);
    if (bVar1) {
      strings::AlphaNum::AlphaNum(&local_e0,"\"");
      str = FieldDescriptor::full_name_abi_cxx11_(field);
      strings::AlphaNum::AlphaNum(&local_110,str);
      strings::AlphaNum::AlphaNum(&local_140,"\"");
      StrCat_abi_cxx11_(&local_b0,(protobuf *)&local_e0,&local_110,&local_140,in_R8);
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    Formatter::operator()
              (format,"::$proto_ns$::internal::VerifyUTF8(str, $1$)",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    if (field_name.field_2._12_4_ == 0) {
      Formatter::operator()<>(format,");\n");
    }
    else if (field_name.field_2._12_4_ == 1) {
      Formatter::operator()<>(format,";\n#endif  // !NDEBUG\n");
    }
    std::__cxx11::string::~string((string *)local_90);
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateStrings(Formatter& format,
                                             const FieldDescriptor* field,
                                             bool check_utf8) {
  FieldOptions::CType ctype = FieldOptions::STRING;
  if (!options_.opensource_runtime) {
    // Open source doesn't support other ctypes;
    ctype = field->options().ctype();
  }
  if (!field->is_repeated() && !options_.opensource_runtime &&
      GetOptimizeFor(field->file(), options_) != FileOptions::LITE_RUNTIME &&
      // For now only use arena string for strings with empty defaults.
      field->default_value_string().empty() &&
      !field->real_containing_oneof() && ctype == FieldOptions::STRING) {
    GenerateArenaString(format, field);
  } else {
    std::string parser_name;
    switch (ctype) {
      case FieldOptions::STRING:
        parser_name = "GreedyStringParser";
        break;
      case FieldOptions::CORD:
        parser_name = "CordParser";
        break;
      case FieldOptions::STRING_PIECE:
        parser_name = "StringPieceParser";
        break;
    }
    format(
        "auto str = $msg$$1$$2$_$name$();\n"
        "ptr = ::$proto_ns$::internal::Inline$3$(str, ptr, ctx);\n",
        HasInternalAccessors(ctype) ? "_internal_" : "",
        field->is_repeated() && !field->is_packable() ? "add" : "mutable",
        parser_name);
  }
  if (!check_utf8) return;  // return if this is a bytes field
  auto level = GetUtf8CheckMode(field, options_);
  switch (level) {
    case Utf8CheckMode::kNone:
      return;
    case Utf8CheckMode::kVerify:
      format("#ifndef NDEBUG\n");
      break;
    case Utf8CheckMode::kStrict:
      format("CHK_(");
      break;
  }
  std::string field_name;
  field_name = "nullptr";
  if (HasDescriptorMethods(field->file(), options_)) {
    field_name = StrCat("\"", field->full_name(), "\"");
  }
  format("::$proto_ns$::internal::VerifyUTF8(str, $1$)", field_name);
  switch (level) {
    case Utf8CheckMode::kNone:
      return;
    case Utf8CheckMode::kVerify:
      format(
          ";\n"
          "#endif  // !NDEBUG\n");
      break;
    case Utf8CheckMode::kStrict:
      format(");\n");
      break;
  }
}